

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall Catch::XmlReporter::assertionEnded(XmlReporter *this,AssertionStats *assertionStats)

{
  string *name;
  XmlWriter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  OfType OVar2;
  pointer pMVar3;
  pointer pcVar4;
  undefined8 this_01;
  int iVar5;
  byte bVar6;
  XmlFormatting fmt;
  pointer pMVar7;
  AssertionStats *pAVar8;
  string local_b0;
  AssertionStats *local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  string local_68;
  undefined1 local_48 [16];
  ostream *poStack_38;
  
  local_48._0_8_ = this;
  iVar5 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[5])();
  bVar6 = 1;
  if ((char)iVar5 == '\0') {
    bVar6 = ((assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) == 0 &
            (byte)(char)(assertionStats->assertionResult).m_resultData.resultType >> 4;
  }
  local_90 = assertionStats;
  if ((bVar6 != 0) || ((assertionStats->assertionResult).m_resultData.resultType == Warning)) {
    pMVar7 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar3 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pMVar7 != pMVar3) {
      name = (string *)(local_48._0_8_ + 0x170);
      do {
        fmt = (XmlFormatting)&local_b0;
        if (pMVar7->type == Info && bVar6 == 1) {
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Info","");
          XmlWriter::scopedElement((XmlWriter *)local_88,name,fmt);
          XmlWriter::writeText((XmlWriter *)local_88._0_8_,&pMVar7->message,Newline|Indent);
LAB_00131c53:
          XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
        }
        else if (pMVar7->type == Warning) {
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Warning","");
          XmlWriter::scopedElement((XmlWriter *)local_88,name,fmt);
          XmlWriter::writeText((XmlWriter *)local_88._0_8_,&pMVar7->message,Newline|Indent);
          goto LAB_00131c53;
        }
        pMVar7 = pMVar7 + 1;
      } while (pMVar7 != pMVar3);
    }
  }
  this_01 = local_48._0_8_;
  pAVar8 = local_90;
  if ((bVar6 | (local_90->assertionResult).m_resultData.resultType == Warning) != 1) {
    return true;
  }
  if ((local_90->assertionResult).m_info.capturedExpression.m_size != 0) {
    paVar1 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Expression","");
    this_00 = (XmlWriter *)(this_01 + 0x170);
    XmlWriter::startElement(this_00,&local_b0,Newline|Indent);
    local_88._0_8_ = (XmlWriter *)local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"success","");
    XmlWriter::writeAttribute
              (this_00,(string *)local_88,
               ((pAVar8->assertionResult).m_resultData.resultType & FailureBit) == Ok);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_78 + 0x10),"type","");
    local_48._8_8_ = (local_90->assertionResult).m_info.macroName.m_start;
    poStack_38 = (ostream *)(local_90->assertionResult).m_info.macroName.m_size;
    XmlWriter::writeAttribute<Catch::StringRef>
              (this_00,(string *)(local_78 + 0x10),(StringRef *)(local_48 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    pAVar8 = local_90;
    if ((XmlWriter *)local_88._0_8_ != (XmlWriter *)local_78) {
      operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    local_b0._M_dataplus._M_p = (pAVar8->assertionResult).m_info.lineInfo.file;
    local_b0._M_string_length = (pAVar8->assertionResult).m_info.lineInfo.line;
    writeSourceInfo((XmlReporter *)this_01,(SourceLineInfo *)&local_b0);
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Original","");
    XmlWriter::scopedElement
              ((XmlWriter *)(local_78 + 0x10),(string *)this_00,(XmlFormatting)&local_b0);
    AssertionResult::getExpression_abi_cxx11_((string *)local_88,&pAVar8->assertionResult);
    XmlWriter::writeText((XmlWriter *)local_68._M_dataplus._M_p,(string *)local_88,Newline|Indent);
    if ((XmlWriter *)local_88._0_8_ != (XmlWriter *)local_78) {
      operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)(local_78 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Expanded","");
    XmlWriter::scopedElement
              ((XmlWriter *)(local_78 + 0x10),(string *)this_00,(XmlFormatting)&local_b0);
    AssertionResult::getExpandedExpression_abi_cxx11_((string *)local_88,&pAVar8->assertionResult);
    XmlWriter::writeText((XmlWriter *)local_68._M_dataplus._M_p,(string *)local_88,Newline|Indent);
    if ((XmlWriter *)local_88._0_8_ != (XmlWriter *)local_78) {
      operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)(local_78 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  OVar2 = (pAVar8->assertionResult).m_resultData.resultType;
  if (OVar2 < ThrewException) {
    if (OVar2 == Info) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Info","");
      XmlWriter::scopedElement
                ((XmlWriter *)(local_78 + 0x10),(string *)(this_01 + 0x170),(XmlFormatting)&local_b0
                );
      pcVar4 = (local_90->assertionResult).m_resultData.message._M_dataplus._M_p;
      local_88._0_8_ = (XmlWriter *)local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,pcVar4,
                 pcVar4 + (local_90->assertionResult).m_resultData.message._M_string_length);
      XmlWriter::writeText((XmlWriter *)local_68._M_dataplus._M_p,(string *)local_88,Newline|Indent)
      ;
      if ((XmlWriter *)local_88._0_8_ != (XmlWriter *)local_78) {
        operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
      }
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)(local_78 + 0x10));
      pAVar8 = local_90;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        pAVar8 = local_90;
      }
      goto LAB_001321dc;
    }
    if (OVar2 != ExplicitFailure) goto LAB_001321dc;
    paVar1 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Failure","");
    XmlWriter::startElement((XmlWriter *)(this_01 + 0x170),&local_b0,Newline|Indent);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    pAVar8 = local_90;
    local_b0._M_dataplus._M_p = (local_90->assertionResult).m_info.lineInfo.file;
    local_b0._M_string_length = (local_90->assertionResult).m_info.lineInfo.line;
    writeSourceInfo((XmlReporter *)this_01,(SourceLineInfo *)&local_b0);
    pcVar4 = (pAVar8->assertionResult).m_resultData.message._M_dataplus._M_p;
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar4,
               pcVar4 + (pAVar8->assertionResult).m_resultData.message._M_string_length);
    XmlWriter::writeText((XmlWriter *)(this_01 + 0x170),&local_b0,Newline|Indent);
  }
  else if (OVar2 == FatalErrorCondition) {
    paVar1 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"FatalErrorCondition","");
    XmlWriter::startElement((XmlWriter *)(this_01 + 0x170),&local_b0,Newline|Indent);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    pAVar8 = local_90;
    local_b0._M_dataplus._M_p = (local_90->assertionResult).m_info.lineInfo.file;
    local_b0._M_string_length = (local_90->assertionResult).m_info.lineInfo.line;
    writeSourceInfo((XmlReporter *)this_01,(SourceLineInfo *)&local_b0);
    pcVar4 = (pAVar8->assertionResult).m_resultData.message._M_dataplus._M_p;
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar4,
               pcVar4 + (pAVar8->assertionResult).m_resultData.message._M_string_length);
    XmlWriter::writeText((XmlWriter *)(this_01 + 0x170),&local_b0,Newline|Indent);
  }
  else {
    if (OVar2 != ThrewException) goto LAB_001321dc;
    paVar1 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Exception","");
    XmlWriter::startElement((XmlWriter *)(this_01 + 0x170),&local_b0,Newline|Indent);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    pAVar8 = local_90;
    local_b0._M_dataplus._M_p = (local_90->assertionResult).m_info.lineInfo.file;
    local_b0._M_string_length = (local_90->assertionResult).m_info.lineInfo.line;
    writeSourceInfo((XmlReporter *)this_01,(SourceLineInfo *)&local_b0);
    pcVar4 = (pAVar8->assertionResult).m_resultData.message._M_dataplus._M_p;
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar4,
               pcVar4 + (pAVar8->assertionResult).m_resultData.message._M_string_length);
    XmlWriter::writeText((XmlWriter *)(this_01 + 0x170),&local_b0,Newline|Indent);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  XmlWriter::endElement((XmlWriter *)(this_01 + 0x170),Newline|Indent);
  pAVar8 = local_90;
LAB_001321dc:
  if ((pAVar8->assertionResult).m_info.capturedExpression.m_size != 0) {
    XmlWriter::endElement((XmlWriter *)(this_01 + 0x170),Newline|Indent);
  }
  return true;
}

Assistant:

bool XmlReporter::assertionEnded( AssertionStats const& assertionStats ) {

        AssertionResult const& result = assertionStats.assertionResult;

        bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

        if( includeResults || result.getResultType() == ResultWas::Warning ) {
            // Print any info messages in <Info> tags.
            for( auto const& msg : assertionStats.infoMessages ) {
                if( msg.type == ResultWas::Info && includeResults ) {
                    m_xml.scopedElement( "Info" )
                            .writeText( msg.message );
                } else if ( msg.type == ResultWas::Warning ) {
                    m_xml.scopedElement( "Warning" )
                            .writeText( msg.message );
                }
            }
        }

        // Drop out if result was successful but we're not printing them.
        if( !includeResults && result.getResultType() != ResultWas::Warning )
            return true;

        // Print the expression if there is one.
        if( result.hasExpression() ) {
            m_xml.startElement( "Expression" )
                .writeAttribute( "success", result.succeeded() )
                .writeAttribute( "type", result.getTestMacroName() );

            writeSourceInfo( result.getSourceInfo() );

            m_xml.scopedElement( "Original" )
                .writeText( result.getExpression() );
            m_xml.scopedElement( "Expanded" )
                .writeText( result.getExpandedExpression() );
        }

        // And... Print a result applicable to each result type.
        switch( result.getResultType() ) {
            case ResultWas::ThrewException:
                m_xml.startElement( "Exception" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::FatalErrorCondition:
                m_xml.startElement( "FatalErrorCondition" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::Info:
                m_xml.scopedElement( "Info" )
                    .writeText( result.getMessage() );
                break;
            case ResultWas::Warning:
                // Warning will already have been written
                break;
            case ResultWas::ExplicitFailure:
                m_xml.startElement( "Failure" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            default:
                break;
        }

        if( result.hasExpression() )
            m_xml.endElement();

        return true;
    }